

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type_ext.cpp
# Opt level: O0

iterator * cs_impl::array_cs_ext::insert(array *arr,iterator *pos,var *val)

{
  _Deque_iterator<cs_impl::any,_cs_impl::any_&,_cs_impl::any_*> *in_RDX;
  iterator *in_RDI;
  any *in_stack_ffffffffffffff78;
  iterator *this;
  EVP_PKEY_CTX local_50 [8];
  value_type *in_stack_ffffffffffffffb8;
  const_iterator *in_stack_ffffffffffffffc0;
  deque<cs_impl::any,_std::allocator<cs_impl::any>_> *in_stack_ffffffffffffffc8;
  
  this = in_RDI;
  std::_Deque_iterator<cs_impl::any,cs_impl::any_const&,cs_impl::any_const*>::
  _Deque_iterator<std::_Deque_iterator<cs_impl::any,cs_impl::any&,cs_impl::any*>,void>
            ((_Deque_iterator<cs_impl::any,cs_impl::any_const&,cs_impl::any_const*> *)
             &stack0xffffffffffffffc0,in_RDX);
  any::any((any *)this,in_stack_ffffffffffffff78);
  cs::copy((EVP_PKEY_CTX *)&stack0xffffffffffffffb8,local_50);
  std::deque<cs_impl::any,_std::allocator<cs_impl::any>_>::insert
            (in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  any::~any((any *)0x439cae);
  any::~any((any *)0x439cb8);
  return in_RDI;
}

Assistant:

array::iterator insert(array &arr, array::iterator &pos, const var &val)
		{
			return arr.insert(pos, copy(val));
		}